

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O2

int CBB_add_asn1_uint64_with_tag(CBB *cbb,uint64_t value,CBS_ASN1_TAG tag)

{
  bool bVar1;
  int iVar2;
  uint8_t value_00;
  long lVar3;
  CBB child;
  
  iVar2 = CBB_add_asn1(cbb,&child,tag);
  if (iVar2 != 0) {
    bVar1 = false;
    for (lVar3 = 0x38; lVar3 != -8; lVar3 = lVar3 + -8) {
      value_00 = (uint8_t)(value >> ((byte)lVar3 & 0x3f));
      if (bVar1) {
LAB_0016e984:
        iVar2 = CBB_add_u8(&child,value_00);
        bVar1 = true;
        if (iVar2 == 0) goto LAB_0016e9d8;
      }
      else {
        if (value_00 != '\0') {
          if ((-1 < (char)value_00) || (iVar2 = CBB_add_u8(&child,'\0'), iVar2 != 0))
          goto LAB_0016e984;
          goto LAB_0016e9d8;
        }
        bVar1 = false;
      }
    }
    if ((bVar1) || (iVar2 = CBB_add_u8(&child,'\0'), iVar2 != 0)) {
      iVar2 = CBB_flush(cbb);
      return iVar2;
    }
  }
LAB_0016e9d8:
  cbb_on_error(cbb);
  return 0;
}

Assistant:

int CBB_add_asn1_uint64_with_tag(CBB *cbb, uint64_t value, CBS_ASN1_TAG tag) {
  CBB child;
  int started = 0;
  if (!CBB_add_asn1(cbb, &child, tag)) {
    goto err;
  }

  for (size_t i = 0; i < 8; i++) {
    uint8_t byte = (value >> 8 * (7 - i)) & 0xff;
    if (!started) {
      if (byte == 0) {
        // Don't encode leading zeros.
        continue;
      }
      // If the high bit is set, add a padding byte to make it
      // unsigned.
      if ((byte & 0x80) && !CBB_add_u8(&child, 0)) {
        goto err;
      }
      started = 1;
    }
    if (!CBB_add_u8(&child, byte)) {
      goto err;
    }
  }

  // 0 is encoded as a single 0, not the empty string.
  if (!started && !CBB_add_u8(&child, 0)) {
    goto err;
  }

  return CBB_flush(cbb);

err:
  cbb_on_error(cbb);
  return 0;
}